

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3SchemaClear(void *p)

{
  u32 *puVar1;
  Table *pTable;
  HashElem *pHVar2;
  Hash temp2;
  Hash temp1;
  Hash local_58;
  Hash local_38;
  
  local_38._0_8_ = *(undefined8 *)((long)p + 8);
  local_38.first = *(HashElem **)((long)p + 0x10);
  local_38.ht = *(_ht **)((long)p + 0x18);
  local_58.ht = *(_ht **)((long)p + 0x48);
  local_58._0_8_ = *(undefined8 *)((long)p + 0x38);
  local_58.first = *(HashElem **)((long)p + 0x40);
  *(undefined8 *)((long)p + 0x38) = 0;
  *(undefined8 *)((long)p + 0x40) = 0;
  *(undefined8 *)((long)p + 0x48) = 0;
  sqlite3HashClear((Hash *)((long)p + 0x20));
  for (pHVar2 = local_58.first; pHVar2 != (HashElem *)0x0; pHVar2 = pHVar2->next) {
    sqlite3DeleteTrigger((sqlite3 *)0x0,(Trigger *)pHVar2->data);
  }
  sqlite3HashClear(&local_58);
  *(undefined8 *)((long)p + 8) = 0;
  *(undefined8 *)((long)p + 0x10) = 0;
  *(undefined8 *)((long)p + 0x18) = 0;
  for (pHVar2 = local_38.first; pHVar2 != (HashElem *)0x0; pHVar2 = pHVar2->next) {
    pTable = (Table *)pHVar2->data;
    if (pTable != (Table *)0x0) {
      puVar1 = &pTable->nTabRef;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        deleteTable((sqlite3 *)0x0,pTable);
      }
    }
  }
  sqlite3HashClear(&local_38);
  sqlite3HashClear((Hash *)((long)p + 0x50));
  *(undefined8 *)((long)p + 0x68) = 0;
  if ((*(ushort *)((long)p + 0x72) & 1) != 0) {
    *(int *)((long)p + 4) = *(int *)((long)p + 4) + 1;
    *(ushort *)((long)p + 0x72) = *(ushort *)((long)p + 0x72) & 0xfffe;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SchemaClear(void *p){
  Hash temp1;
  Hash temp2;
  HashElem *pElem;
  Schema *pSchema = (Schema *)p;

  temp1 = pSchema->tblHash;
  temp2 = pSchema->trigHash;
  sqlite3HashInit(&pSchema->trigHash);
  sqlite3HashClear(&pSchema->idxHash);
  for(pElem=sqliteHashFirst(&temp2); pElem; pElem=sqliteHashNext(pElem)){
    sqlite3DeleteTrigger(0, (Trigger*)sqliteHashData(pElem));
  }
  sqlite3HashClear(&temp2);
  sqlite3HashInit(&pSchema->tblHash);
  for(pElem=sqliteHashFirst(&temp1); pElem; pElem=sqliteHashNext(pElem)){
    Table *pTab = sqliteHashData(pElem);
    sqlite3DeleteTable(0, pTab);
  }
  sqlite3HashClear(&temp1);
  sqlite3HashClear(&pSchema->fkeyHash);
  pSchema->pSeqTab = 0;
  if( pSchema->schemaFlags & DB_SchemaLoaded ){
    pSchema->iGeneration++;
    pSchema->schemaFlags &= ~DB_SchemaLoaded;
  }
}